

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

void __thiscall
spatial_region::f_init_focused
          (spatial_region *this,double a0y,double a0z,double xsigma,double sigma0,double x0,
          double x1,bool b_sign,double phase,double y0,double z0,bool append,double phi,int sscos,
          double K,double xtarget,double ytarget,double ztarget)

{
  undefined8 *puVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  int iVar93;
  int iVar94;
  celle *pcVar95;
  cellb *pcVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  undefined1 auVar100 [16];
  double dVar101;
  undefined1 auVar102 [16];
  undefined8 uVar103;
  double dVar104;
  bool bVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  uint uVar126;
  int iVar127;
  ulong uVar128;
  int iVar129;
  long lVar130;
  long lVar131;
  long lVar132;
  long lVar133;
  double dVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  ulong uVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  undefined8 in_XMM0_Qb;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined8 extraout_XMM0_Qb_04;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined1 auVar235 [64];
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined1 auVar236 [64];
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double __x;
  undefined8 in_XMM1_Qb;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  double dVar321;
  double dVar322;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  ulong in_XMM4_Qb;
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 in_register_00001348 [56];
  undefined1 auVar342 [64];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined8 in_XMM7_Qb;
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  double dVar348;
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 in_XMM16 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_338 [16];
  double local_310;
  double local_308;
  double local_2e8;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  ulong local_2a8;
  double local_298;
  ulong local_278;
  double local_268;
  double local_258;
  double local_248;
  double local_228;
  ulong local_218;
  undefined1 local_1f8 [16];
  double local_1b8;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined1 local_118 [16];
  double local_98;
  double dStack_90;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  auVar342._8_56_ = in_register_00001348;
  auVar342._0_8_ = x1;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = z0;
  local_388._8_8_ = local_388._0_8_;
  local_388._0_8_ = sigma0;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = y0 * y0;
  auVar345 = vfmadd213sd_fma(auVar342._0_16_,auVar342._0_16_,auVar345);
  auVar345 = vfmadd231sd_fma(auVar345,auVar241,auVar241);
  auVar345 = vsqrtsd_avx(auVar345,auVar345);
  dVar97 = sigma0 * K * sigma0 * 0.5;
  uVar103 = vcmpsd_avx512f(auVar345,ZEXT816(0) << 0x40,0);
  bVar105 = (bool)((byte)uVar103 & 1);
  dVar104 = (double)((ulong)bVar105 * (long)this->dx + (ulong)!bVar105 * auVar345._0_8_);
  dVar98 = dVar104 * dVar104;
  dVar140 = (dVar98 / dVar97) / dVar97 + 1.0;
  if (dVar140 < 0.0) {
    dVar140 = sqrt(dVar140);
  }
  else {
    auVar135._8_8_ = 0;
    auVar135._0_8_ = dVar140;
    auVar345 = vsqrtsd_avx(auVar135,auVar135);
    dVar140 = auVar345._0_8_;
  }
  dVar141 = dVar98 / (sigma0 * sigma0 * sigma0 * sigma0 * 0.25) + 1.0;
  if (dVar141 < 0.0) {
    dVar141 = sqrt(dVar141);
  }
  else {
    auVar151._8_8_ = 0;
    auVar151._0_8_ = dVar141;
    auVar345 = vsqrtsd_avx(auVar151,auVar151);
    dVar141 = auVar345._0_8_;
  }
  iVar93 = this->ny;
  auVar106._8_8_ = in_XMM7_Qb;
  auVar106._0_8_ = y0;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = y0 * y0;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = z0;
  dVar4 = this->dy;
  iVar94 = this->nz;
  dVar237 = this->dz;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = dVar104;
  auVar241 = vfmsub231sd_fma(auVar338,auVar100,auVar100);
  auVar345 = vunpcklpd_avx(auVar106,auVar288);
  auVar102._8_8_ = 0x8000000000000000;
  auVar102._0_8_ = 0x8000000000000000;
  auVar135 = vxorpd_avx512vl(auVar345,auVar102);
  auVar345 = vshufps_avx(auVar135,auVar135,0x4e);
  auVar345 = vfmadd213sd_fma(auVar345,auVar288,auVar241);
  if (auVar345._0_8_ < 0.0) {
    dVar142 = sqrt(auVar345._0_8_);
  }
  else {
    auVar345 = vsqrtsd_avx(auVar345,auVar345);
    dVar142 = auVar345._0_8_;
  }
  uVar126 = 0;
  auVar343._0_8_ = (dVar142 * (double)(int)-(((0.0 < x1) - 1) + (uint)(0.0 < x1))) / dVar104;
  auVar343._8_8_ = 0;
  auVar152._8_8_ = dVar104;
  auVar152._0_8_ = dVar104;
  auVar345 = vdivpd_avx(auVar135,auVar152);
  dVar142 = auVar345._0_8_;
  auVar242._0_8_ = -dVar142;
  auVar242._8_8_ = auVar345._8_8_ ^ 0x8000000000000000;
  auVar135 = vunpcklpd_avx(auVar242,auVar343);
  auVar153._8_8_ = 0;
  auVar153._0_8_ = dVar142 * dVar142;
  auVar241 = vfmadd231sd_fma(auVar153,auVar343,auVar343);
  auVar241 = vsqrtsd_avx(auVar241,auVar241);
  auVar154._0_8_ = auVar241._0_8_;
  auVar241 = vmovhpd_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  auVar154._8_8_ = auVar154._0_8_;
  if (auVar154._0_8_ != 0.0) {
    uVar126 = 0xff;
  }
  if (NAN(auVar154._0_8_)) {
    uVar126 = 0xff;
  }
  auVar135 = vdivpd_avx512vl(auVar135,auVar154);
  bVar105 = (bool)((byte)uVar126 & 1);
  auVar136._0_8_ = (double)((ulong)bVar105 * auVar135._0_8_ | (ulong)!bVar105 * auVar241._0_8_);
  bVar105 = (bool)((byte)(uVar126 >> 1) & 1);
  auVar136._8_8_ = (double)((ulong)bVar105 * auVar135._8_8_ | (ulong)!bVar105 * auVar241._8_8_);
  auVar241 = vshufpd_avx(auVar345,auVar345,1);
  auVar135 = vshufpd_avx(auVar136,auVar343,1);
  auVar102 = vunpcklpd_avx(ZEXT816(0) << 0x40,auVar136);
  auVar151 = vshufpd_avx(auVar136,auVar136,1);
  auVar137._0_8_ = auVar135._0_8_ * -auVar241._0_8_;
  auVar137._8_8_ = auVar135._8_8_ * -0.0;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = auVar136._0_8_ * dVar142;
  auVar106 = vfmsub213sd_fma(auVar151,auVar343,auVar289);
  auVar151 = vfmadd213pd_fma(auVar102,auVar345,auVar137);
  if ((phi != 0.0) || (NAN(phi))) {
    local_338._0_8_ = cos(phi);
    local_338._8_8_ = extraout_XMM0_Qb;
    dVar143 = sin(phi);
    auVar323._8_8_ = local_338._0_8_;
    auVar323._0_8_ = local_338._0_8_;
    auVar243._8_8_ = 0;
    auVar243._0_8_ = auVar106._0_8_ * dVar143;
    auVar102 = vfmadd213sd_fma(ZEXT816(0) << 0x40,local_338,auVar243);
    local_310 = auVar102._0_8_;
    auVar290._0_8_ = auVar151._0_8_ * dVar143;
    auVar290._8_8_ = auVar151._8_8_ * dVar143;
    auVar244._0_8_ = auVar136._0_8_ * dVar143;
    auVar244._8_8_ = auVar136._8_8_ * dVar143;
    auVar136 = vfmadd231pd_fma(auVar290,auVar136,auVar323);
    auVar151 = vfmsub231pd_fma(auVar244,auVar151,auVar323);
    auVar155._8_8_ = 0;
    auVar155._0_8_ = dVar143 * -0.0;
    auVar106 = vfmadd231sd_fma(auVar155,auVar106,local_338);
  }
  else {
    local_310 = 0.0;
  }
  iVar127 = this->nx;
  if (0 < iVar127) {
    iVar129 = this->ny;
    lVar132 = 0;
    dVar143 = dVar97 * dVar97;
    auVar245._8_8_ = 0;
    auVar245._0_8_ = dVar98 / dVar143 + 1.0;
    auVar288 = vsqrtsd_avx(auVar245,auVar245);
    dVar348 = ((xsigma + xsigma) * 2.5066282746310002) / 3.0;
    dVar99 = xsigma * 0.822;
    dVar134 = (double)((ulong)(sscos == 1) * (long)dVar99 + (ulong)(sscos != 1) * (long)dVar348);
    dVar321 = (sigma0 * 0.5) / 0.29356228701531506;
    auVar349._0_8_ = -x0;
    auVar349._8_8_ = in_XMM4_Qb ^ 0x8000000000000000;
    dVar98 = (double)iVar93 * dVar4 * -0.5;
    dVar4 = (double)iVar94 * dVar237 * -0.5;
    dVar237 = dVar104 / dVar97;
    dVar238 = 3.141592653589793 / dVar348;
    dVar239 = -dVar238;
    dVar240 = -K;
    dVar99 = dVar99 * dVar99 * dVar99 * dVar99;
    auVar135 = vshufpd_avx(auVar135,auVar345,1);
    auVar102 = vshufpd_avx(auVar151,auVar151,1);
    auVar100 = vshufpd_avx(auVar136,auVar136,1);
    auVar123._8_8_ = in_XMM1_Qb;
    auVar123._0_8_ = a0z;
    auVar111._8_8_ = in_XMM0_Qb;
    auVar111._0_8_ = a0y;
    auVar338 = vunpcklpd_avx(auVar123,auVar111);
    do {
      if (0 < iVar129) {
        uVar128 = (ulong)(uint)this->nz;
        auVar152 = vcvtsi2sd_avx512f(in_XMM16,(int)lVar132);
        lVar131 = 0;
        uVar144 = auVar152._0_8_;
        do {
          if (0 < (int)uVar128) {
            auVar152 = vcvtsi2sd_avx512f(in_XMM16,(int)lVar131);
            lVar130 = 0;
            lVar133 = 0;
            auVar341._0_8_ = auVar152._0_8_;
            do {
              auVar156._8_8_ = 0;
              auVar156._0_8_ = this->dx;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = uVar144;
              auVar153 = vfmadd132sd_fma(auVar156,auVar349,auVar5);
              dVar149 = auVar153._0_8_ - xtarget;
              auVar157._8_8_ = 0;
              auVar157._0_8_ = this->dy;
              auVar333._8_8_ = 0;
              auVar333._0_8_ = dVar98;
              auVar152 = vfmadd213sd_fma(auVar157,auVar152,auVar333);
              dVar145 = (auVar152._0_8_ - y0) - ytarget;
              auVar291._8_8_ = 0;
              auVar291._0_8_ = this->dz;
              auVar152 = vcvtsi2sd_avx512f(in_XMM16,(int)lVar133);
              auVar6._8_8_ = 0;
              auVar6._0_8_ = dVar4;
              auVar153 = vfmadd213sd_fma(auVar291,auVar152,auVar6);
              auVar158._8_8_ = 0;
              auVar158._0_8_ = dVar145 * dVar145;
              auVar246._8_8_ = 0;
              auVar246._0_8_ = dVar149;
              auVar154 = vfmadd231sd_fma(auVar158,auVar246,auVar246);
              auVar247._8_8_ = 0;
              auVar247._0_8_ = dVar149;
              auVar339._8_8_ = 0;
              auVar339._0_8_ = dVar145 * dVar142;
              auVar242 = vfmadd231sd_fma(auVar339,auVar343,auVar247);
              dVar149 = (auVar153._0_8_ - z0) - ztarget;
              auVar7._8_8_ = 0;
              auVar7._0_8_ = auVar241._0_8_;
              auVar292._8_8_ = 0;
              auVar292._0_8_ = dVar149;
              auVar153 = vfmadd231sd_fma(auVar242,auVar292,auVar7);
              auVar293._8_8_ = 0;
              auVar293._0_8_ = dVar149;
              auVar154 = vfmadd231sd_fma(auVar154,auVar292,auVar293);
              dVar149 = auVar153._0_8_;
              auVar153 = vfnmadd231sd_fma(auVar154,auVar153,auVar153);
              uVar128 = auVar152._0_8_;
              if (auVar153._0_8_ < 0.0) {
                dVar145 = sqrt(auVar153._0_8_);
              }
              else {
                auVar152 = vsqrtsd_avx(auVar153,auVar153);
                dVar145 = auVar152._0_8_;
              }
              dVar101 = dVar149 - dVar104;
              auVar294._8_8_ = 0;
              auVar294._0_8_ = dVar101;
              auVar8._8_8_ = 0;
              auVar8._0_8_ = dVar143;
              auVar152 = vfmadd213sd_fma(auVar294,auVar294,auVar8);
              dVar322 = auVar152._0_8_;
              dVar146 = atan(dVar101 / dVar97);
              dVar147 = atan(dVar237);
              dVar147 = ((dVar149 + (dVar145 * dVar145 * 0.5 * dVar101) / dVar322) - dVar146) -
                        dVar147;
              local_388._0_8_ = dVar147 - dVar104;
              dVar146 = atan(dVar237);
              dVar148 = atan(dVar237);
              dVar146 = ((dVar148 + (double)local_388._0_8_) * (dVar146 + (double)local_388._0_8_))
                        / dVar143 + 1.0;
              if (dVar146 < 0.0) {
                dVar146 = sqrt(dVar146);
              }
              else {
                auVar159._8_8_ = 0;
                auVar159._0_8_ = dVar146;
                auVar152 = vsqrtsd_avx(auVar159,auVar159);
                dVar146 = auVar152._0_8_;
              }
              if (((dVar147 <= -dVar134) || (dVar134 <= dVar147)) ||
                 (dVar146 = dVar146 * dVar321, dVar146 <= dVar145)) {
                if (!append) {
                  pcVar95 = (this->ce).p._M_t.
                            super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                            super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar132][lVar131];
                  *(undefined8 *)((long)&pcVar95->ez + lVar130) = 0;
                  puVar1 = (undefined8 *)((long)&pcVar95->ex + lVar130);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  pcVar96 = (this->cb).p._M_t.
                            super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                            super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar132][lVar131];
                  *(undefined8 *)((long)&pcVar96->bz + lVar130) = 0;
                  puVar1 = (undefined8 *)((long)&pcVar96->bx + lVar130);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                }
              }
              else {
                dVar148 = (((sigma0 * dVar140 * 0.5) / 0.29356228701531506) / dVar146) *
                          (dVar141 / auVar288._0_8_);
                local_98 = auVar338._0_8_;
                dStack_90 = auVar338._8_8_;
                local_1b8 = auVar100._0_8_;
                local_298 = auVar136._0_8_;
                local_248 = auVar102._0_8_;
                local_2a8 = auVar151._0_8_;
                local_218 = auVar106._0_8_;
                if (sscos == 1) {
                  dVar149 = (dVar147 * dVar147 * dVar147 * dVar147 * 3.141592653589793 * 0.5) /
                            dVar99;
                  local_338._0_8_ = cos(dVar149);
                  local_338._8_8_ = extraout_XMM0_Qb_00;
                  dVar150 = (dVar145 * 3.141592653589793 * 0.5) / dVar146;
                  local_2e8 = cos(dVar150);
                  local_258 = sin(dVar149);
                  dVar149 = sin(dVar150);
                  auVar248._8_8_ = 0;
                  auVar248._0_8_ = dVar147;
                  auVar160._8_8_ = 0;
                  auVar160._0_8_ = K;
                  auVar9._8_8_ = 0;
                  auVar9._0_8_ = phase;
                  auVar152 = vfmadd213sd_fma(auVar248,auVar160,auVar9);
                  local_388._0_8_ = auVar152._0_8_;
                  dVar150 = cos((double)local_388._0_8_);
                  local_378._0_8_ = (dVar147 * dVar147 * dVar147 * 12.566370614359172) / dVar99;
                  local_378._8_8_ = 0;
                  local_1f8._0_8_ = sin((double)local_388._0_8_);
                  local_1f8._8_8_ = extraout_XMM0_Qb_02;
                  local_118._0_8_ = sin((double)local_388._0_8_);
                  local_118._8_8_ = extraout_XMM0_Qb_03;
                  auVar235._0_8_ = cos((double)local_388._0_8_);
                  auVar235._8_56_ = extraout_var;
                  auVar121._8_4_ = 0;
                  auVar121._0_8_ = -dVar148;
                  auVar121._12_4_ = 0x80000000;
                  auVar112._8_4_ = 0;
                  auVar112._0_8_ = -(double)local_378._0_8_;
                  auVar112._12_4_ = 0x80000000;
                  auVar152 = vunpcklpd_avx(auVar235._0_16_,auVar112);
                  auVar124._8_8_ = K;
                  auVar124._0_8_ = K;
                  auVar324._8_8_ = local_338._0_8_;
                  auVar324._0_8_ = local_338._0_8_;
                  auVar118._8_8_ = 0;
                  auVar118._0_8_ = dVar148;
                  auVar153 = vunpcklpd_avx(auVar121,auVar118);
                  auVar154 = vunpcklpd_avx(local_378,local_1f8);
                  auVar344._0_8_ = auVar153._0_8_ * local_98;
                  auVar344._8_8_ = auVar153._8_8_ * dStack_90;
                  auVar249._0_8_ = local_2e8 * auVar344._0_8_ * local_2e8;
                  auVar249._8_8_ = local_2e8 * auVar344._8_8_ * local_2e8;
                  auVar114._8_8_ = extraout_XMM0_Qb_01;
                  auVar114._0_8_ = dVar150;
                  auVar153 = vunpcklpd_avx(local_118,auVar114);
                  auVar161._0_8_ =
                       local_258 * (double)local_338._0_8_ * auVar154._0_8_ * auVar152._0_8_;
                  auVar161._8_8_ =
                       local_258 * (double)local_338._0_8_ * auVar154._8_8_ * auVar152._8_8_;
                  auVar152 = vdivpd_avx(auVar249,auVar124);
                  auVar295._0_8_ = (double)local_338._0_8_ * auVar153._0_8_ * K;
                  auVar295._8_8_ = (double)local_338._0_8_ * auVar153._8_8_ * K;
                  auVar153 = vfmadd231pd_fma(auVar161,auVar324,auVar295);
                  local_118._0_8_ = auVar152._0_8_ * auVar153._0_8_;
                  local_118._8_8_ = auVar152._8_8_ * auVar153._8_8_;
                  dVar150 = -(double)local_118._0_8_;
                  if ((dVar145 != 0.0) || (NAN(dVar145))) {
                    auVar109._8_8_ = 0;
                    auVar109._0_8_ = dVar146;
                    auVar153 = vunpcklpd_avx(auVar124,auVar109);
                    auVar296._8_8_ = 0;
                    auVar296._0_8_ = dVar98;
                    local_128 = (undefined4)local_118._0_8_;
                    uStack_124 = (undefined4)((ulong)dVar150 >> 0x20);
                    auVar162._8_8_ = 0;
                    auVar162._0_8_ = dVar149 * local_2e8 * 3.141592653589793;
                    auVar152 = vshufpd_avx(auVar344,auVar162,1);
                    auVar152 = vdivpd_avx(auVar152,auVar153);
                    auVar163._8_8_ = 0;
                    auVar163._0_8_ = this->dx;
                    auVar10._8_8_ = 0;
                    auVar10._0_8_ = uVar144;
                    auVar153 = vfmadd132sd_fma(auVar163,auVar349,auVar10);
                    auVar250._8_8_ = 0;
                    auVar250._0_8_ = this->dy;
                    auVar11._8_8_ = 0;
                    auVar11._0_8_ = auVar341._0_8_;
                    auVar154 = vfmadd132sd_fma(auVar250,auVar296,auVar11);
                    auVar297._8_8_ = 0;
                    auVar297._0_8_ = uVar128;
                    auVar12._8_8_ = 0;
                    auVar12._0_8_ = local_298;
                    auVar164._8_8_ = 0;
                    auVar164._0_8_ = auVar153._0_8_ - xtarget;
                    auVar251._8_8_ = 0;
                    auVar251._0_8_ = ((auVar154._0_8_ - y0) - ytarget) * local_1b8;
                    auVar154 = vfmadd231sd_fma(auVar251,auVar164,auVar12);
                    auVar165._8_8_ = 0;
                    auVar165._0_8_ = this->dz;
                    auVar13._8_8_ = 0;
                    auVar13._0_8_ = dVar4;
                    auVar153 = vfmadd213sd_fma(auVar165,auVar297,auVar13);
                    auVar14._8_8_ = 0;
                    auVar14._0_8_ = local_310;
                    auVar166._8_8_ = 0;
                    auVar166._0_8_ = (auVar153._0_8_ - z0) - ztarget;
                    auVar154 = vfmadd132sd_fma(auVar166,auVar154,auVar14);
                    auVar153 = vshufpd_avx(auVar152,auVar152,1);
                    dVar149 = sin((double)local_388._0_8_);
                    dVar146 = cos((double)local_388._0_8_);
                    auVar298._8_8_ = 0;
                    auVar298._0_8_ = dVar98;
                    auVar15._8_8_ = 0;
                    auVar15._0_8_ = dVar149 * K * (double)local_338._0_8_;
                    auVar167._8_8_ = 0;
                    auVar167._0_8_ =
                         (double)local_338._0_8_ * dVar146 * (double)local_378._0_8_ * local_258;
                    auVar289 = vfmadd231sd_fma(auVar167,local_338,auVar15);
                    auVar168._8_8_ = 0;
                    auVar168._0_8_ = this->dx;
                    auVar16._8_8_ = 0;
                    auVar16._0_8_ = uVar144;
                    auVar242 = vfmadd132sd_fma(auVar168,auVar349,auVar16);
                    auVar252._8_8_ = 0;
                    auVar252._0_8_ = this->dy;
                    auVar17._8_8_ = 0;
                    auVar17._0_8_ = auVar341._0_8_;
                    auVar137 = vfmadd132sd_fma(auVar252,auVar298,auVar17);
                    auVar299._8_8_ = 0;
                    auVar299._0_8_ = uVar128;
                    auVar18._8_8_ = 0;
                    auVar18._0_8_ = local_298;
                    auVar169._8_8_ = 0;
                    auVar169._0_8_ = auVar242._0_8_ - xtarget;
                    auVar253._8_8_ = 0;
                    auVar253._0_8_ = ((auVar137._0_8_ - y0) - ytarget) * local_1b8;
                    auVar137 = vfmadd231sd_fma(auVar253,auVar169,auVar18);
                    auVar170._8_8_ = 0;
                    auVar170._0_8_ = this->dz;
                    auVar19._8_8_ = 0;
                    auVar19._0_8_ = dVar4;
                    auVar242 = vfmadd213sd_fma(auVar170,auVar299,auVar19);
                    auVar20._8_8_ = 0;
                    auVar20._0_8_ = local_310;
                    auVar171._8_8_ = 0;
                    auVar171._0_8_ = (auVar242._0_8_ - z0) - ztarget;
                    auVar242 = vfmadd132sd_fma(auVar171,auVar137,auVar20);
                    local_308 = (double)local_338._0_8_ * (double)local_338._0_8_;
                    dVar149 = cos((double)local_388._0_8_);
                    local_268 = (double)local_378._0_8_ * (double)local_338._0_8_ * local_258;
                    dVar146 = sin((double)local_388._0_8_);
                    auVar254._8_8_ = 0;
                    auVar254._0_8_ = dVar149 * dVar240;
                    auVar300._8_8_ = 0;
                    auVar300._0_8_ = dVar98;
                    auVar21._8_8_ = 0;
                    auVar21._0_8_ = local_308;
                    auVar172._8_8_ = 0;
                    auVar172._0_8_ = dVar146 * local_268;
                    auVar137 = vfmadd231sd_fma(auVar172,auVar254,auVar21);
                    auVar255._8_8_ = 0;
                    auVar255._0_8_ = auVar289._0_8_;
                    auVar22._8_8_ = 0;
                    auVar22._0_8_ = (auVar153._0_8_ * auVar154._0_8_) / dVar145;
                    auVar173._8_8_ = 0;
                    auVar173._0_8_ =
                         auVar137._0_8_ *
                         local_2e8 * local_2e8 * ((auVar242._0_8_ * dVar101) / dVar322);
                    auVar289 = vfmadd231sd_fma(auVar173,auVar255,auVar22);
                    auVar174._8_8_ = 0;
                    auVar174._0_8_ = this->dx;
                    auVar23._8_8_ = 0;
                    auVar23._0_8_ = uVar144;
                    auVar154 = vfmadd132sd_fma(auVar174,auVar349,auVar23);
                    auVar256._8_8_ = 0;
                    auVar256._0_8_ = this->dy;
                    auVar24._8_8_ = 0;
                    auVar24._0_8_ = auVar341._0_8_;
                    auVar242 = vfmadd132sd_fma(auVar256,auVar300,auVar24);
                    auVar301._8_8_ = 0;
                    auVar301._0_8_ = uVar128;
                    auVar25._8_8_ = 0;
                    auVar25._0_8_ = local_2a8;
                    auVar175._8_8_ = 0;
                    auVar175._0_8_ = auVar154._0_8_ - xtarget;
                    auVar257._8_8_ = 0;
                    auVar257._0_8_ = ((auVar242._0_8_ - y0) - ytarget) * local_248;
                    auVar242 = vfmadd231sd_fma(auVar257,auVar175,auVar25);
                    auVar176._8_8_ = 0;
                    auVar176._0_8_ = this->dz;
                    auVar26._8_8_ = 0;
                    auVar26._0_8_ = dVar4;
                    auVar154 = vfmadd213sd_fma(auVar176,auVar301,auVar26);
                    auVar27._8_8_ = 0;
                    auVar27._0_8_ = local_218;
                    auVar177._8_8_ = 0;
                    auVar177._0_8_ = (auVar154._0_8_ - z0) - ztarget;
                    auVar154 = vfmadd132sd_fma(auVar177,auVar242,auVar27);
                    dVar149 = cos((double)local_388._0_8_);
                    dVar146 = sin((double)local_388._0_8_);
                    auVar302._8_8_ = 0;
                    auVar302._0_8_ = dVar98;
                    auVar28._8_8_ = 0;
                    auVar28._0_8_ = dVar149 * dVar240 * (double)local_338._0_8_;
                    auVar178._8_8_ = 0;
                    auVar178._0_8_ =
                         (double)local_338._0_8_ * dVar146 * -(double)local_378._0_8_ * local_258;
                    auVar155 = vfmadd231sd_fma(auVar178,local_338,auVar28);
                    auVar179._8_8_ = 0;
                    auVar179._0_8_ = this->dx;
                    auVar29._8_8_ = 0;
                    auVar29._0_8_ = uVar144;
                    auVar242 = vfmadd132sd_fma(auVar179,auVar349,auVar29);
                    auVar258._8_8_ = 0;
                    auVar258._0_8_ = this->dy;
                    auVar30._8_8_ = 0;
                    auVar30._0_8_ = auVar341._0_8_;
                    auVar137 = vfmadd132sd_fma(auVar258,auVar302,auVar30);
                    auVar303._8_8_ = 0;
                    auVar303._0_8_ = uVar128;
                    auVar31._8_8_ = 0;
                    auVar31._0_8_ = local_2a8;
                    auVar180._8_8_ = 0;
                    auVar180._0_8_ = auVar242._0_8_ - xtarget;
                    auVar259._8_8_ = 0;
                    auVar259._0_8_ = ((auVar137._0_8_ - y0) - ytarget) * local_248;
                    auVar137 = vfmadd231sd_fma(auVar259,auVar180,auVar31);
                    auVar181._8_8_ = 0;
                    auVar181._0_8_ = this->dz;
                    auVar32._8_8_ = 0;
                    auVar32._0_8_ = dVar4;
                    auVar242 = vfmadd213sd_fma(auVar181,auVar303,auVar32);
                    auVar33._8_8_ = 0;
                    auVar33._0_8_ = local_218;
                    auVar182._8_8_ = 0;
                    auVar182._0_8_ = (auVar242._0_8_ - z0) - ztarget;
                    auVar242 = vfmadd132sd_fma(auVar182,auVar137,auVar33);
                    dVar149 = sin((double)local_388._0_8_);
                    dVar146 = cos((double)local_388._0_8_);
                    auVar115._8_8_ = 0;
                    auVar115._0_8_ = local_268;
                    auVar107._8_8_ = 0x8000000000000000;
                    auVar107._0_8_ = 0x8000000000000000;
                    auVar137 = vxorpd_avx512vl(auVar115,auVar107);
                    local_228 = auVar137._0_8_;
                    auVar260._8_8_ = 0;
                    auVar260._0_8_ = dVar149 * dVar240;
                    auVar34._8_8_ = 0;
                    auVar34._0_8_ = local_308;
                    auVar183._8_8_ = 0;
                    auVar183._0_8_ = dVar146 * local_268;
                    auVar137 = vfmsub231sd_fma(auVar183,auVar260,auVar34);
                    auVar261._8_8_ = 0;
                    auVar261._0_8_ = auVar155._0_8_;
                    auVar35._8_8_ = 0;
                    auVar35._0_8_ = (auVar154._0_8_ * auVar153._0_8_) / dVar145;
                    auVar184._8_8_ = 0;
                    auVar184._0_8_ =
                         auVar137._0_8_ *
                         local_2e8 * local_2e8 * ((auVar242._0_8_ * dVar101) / dVar322);
                    auVar153 = vfmadd231sd_fma(auVar184,auVar261,auVar35);
                    auVar36._8_8_ = 0;
                    auVar36._0_8_ = auVar289._0_8_;
                    auVar185._8_8_ = 0;
                    auVar185._0_8_ = (auVar344._0_8_ / K) * auVar153._0_8_;
                    auVar153 = vfmadd231sd_fma(auVar185,auVar152,auVar36);
                    local_278 = auVar153._0_8_;
                    dVar149 = -(double)local_378._0_8_;
LAB_00110ed2:
                    auVar186._8_8_ = 0;
                    auVar186._0_8_ = this->dx;
                    auVar325._8_8_ = 0;
                    auVar325._0_8_ = auVar341._0_8_;
                    auVar37._8_8_ = 0;
                    auVar37._0_8_ = uVar144;
                    auVar153 = vfmadd132sd_fma(auVar186,auVar349,auVar37);
                    auVar262._8_8_ = 0;
                    auVar262._0_8_ = this->dy;
                    auVar38._8_8_ = 0;
                    auVar38._0_8_ = dVar98;
                    auVar154 = vfmadd213sd_fma(auVar262,auVar325,auVar38);
                    auVar326._8_8_ = 0;
                    auVar326._0_8_ = uVar128;
                    auVar39._8_8_ = 0;
                    auVar39._0_8_ = local_2a8;
                    auVar187._8_8_ = 0;
                    auVar187._0_8_ = auVar153._0_8_ - xtarget;
                    auVar263._8_8_ = 0;
                    auVar263._0_8_ = ((auVar154._0_8_ - y0) - ytarget) * local_248;
                    auVar154 = vfmadd231sd_fma(auVar263,auVar187,auVar39);
                    auVar188._8_8_ = 0;
                    auVar188._0_8_ = this->dz;
                    auVar40._8_8_ = 0;
                    auVar40._0_8_ = dVar4;
                    auVar153 = vfmadd213sd_fma(auVar188,auVar326,auVar40);
                    auVar41._8_8_ = 0;
                    auVar41._0_8_ = local_218;
                    auVar189._8_8_ = 0;
                    auVar189._0_8_ = (auVar153._0_8_ - z0) - ztarget;
                    auVar154 = vfmadd132sd_fma(auVar189,auVar154,auVar41);
                    auVar153 = vshufpd_avx(auVar152,auVar152,1);
                    dVar146 = sin((double)local_388._0_8_);
                    dVar147 = cos((double)local_388._0_8_);
                    auVar304._8_8_ = 0;
                    auVar304._0_8_ = auVar341._0_8_;
                    auVar42._8_8_ = 0;
                    auVar42._0_8_ = dVar146 * K * (double)local_338._0_8_;
                    auVar190._8_8_ = 0;
                    auVar190._0_8_ =
                         (double)local_338._0_8_ * dVar147 * (double)local_378._0_8_ * local_258;
                    auVar289 = vfmadd231sd_fma(auVar190,local_338,auVar42);
                    auVar191._8_8_ = 0;
                    auVar191._0_8_ = this->dx;
                    auVar43._8_8_ = 0;
                    auVar43._0_8_ = uVar144;
                    auVar242 = vfmadd132sd_fma(auVar191,auVar349,auVar43);
                    auVar264._8_8_ = 0;
                    auVar264._0_8_ = this->dy;
                    auVar44._8_8_ = 0;
                    auVar44._0_8_ = dVar98;
                    auVar137 = vfmadd213sd_fma(auVar264,auVar304,auVar44);
                    auVar305._8_8_ = 0;
                    auVar305._0_8_ = uVar128;
                    auVar45._8_8_ = 0;
                    auVar45._0_8_ = local_2a8;
                    auVar192._8_8_ = 0;
                    auVar192._0_8_ = auVar242._0_8_ - xtarget;
                    auVar265._8_8_ = 0;
                    auVar265._0_8_ = ((auVar137._0_8_ - y0) - ytarget) * local_248;
                    auVar137 = vfmadd231sd_fma(auVar265,auVar192,auVar45);
                    auVar193._8_8_ = 0;
                    auVar193._0_8_ = this->dz;
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = dVar4;
                    auVar242 = vfmadd213sd_fma(auVar193,auVar305,auVar46);
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = local_218;
                    auVar194._8_8_ = 0;
                    auVar194._0_8_ = (auVar242._0_8_ - z0) - ztarget;
                    auVar242 = vfmadd132sd_fma(auVar194,auVar137,auVar47);
                    dVar146 = cos((double)local_388._0_8_);
                    dVar147 = sin((double)local_388._0_8_);
                    auVar266._8_8_ = 0;
                    auVar266._0_8_ = dVar146 * dVar240;
                    auVar306._8_8_ = 0;
                    auVar306._0_8_ = auVar341._0_8_;
                    auVar48._8_8_ = 0;
                    auVar48._0_8_ = local_308;
                    auVar195._8_8_ = 0;
                    auVar195._0_8_ = dVar147 * local_268;
                    auVar137 = vfmadd231sd_fma(auVar195,auVar266,auVar48);
                    auVar267._8_8_ = 0;
                    auVar267._0_8_ = auVar289._0_8_;
                    auVar49._8_8_ = 0;
                    auVar49._0_8_ = (auVar153._0_8_ * auVar154._0_8_) / dVar145;
                    auVar196._8_8_ = 0;
                    auVar196._0_8_ =
                         auVar137._0_8_ *
                         local_2e8 * local_2e8 * ((auVar242._0_8_ * dVar101) / dVar322);
                    auVar154 = vfmadd231sd_fma(auVar196,auVar267,auVar49);
                    auVar208._0_8_ = auVar154._0_8_;
                    auVar197._8_8_ = 0;
                    auVar197._0_8_ = this->dx;
                    auVar50._8_8_ = 0;
                    auVar50._0_8_ = uVar144;
                    auVar154 = vfmadd132sd_fma(auVar197,auVar349,auVar50);
                    auVar268._8_8_ = 0;
                    auVar268._0_8_ = this->dy;
                    auVar51._8_8_ = 0;
                    auVar51._0_8_ = dVar98;
                    auVar242 = vfmadd213sd_fma(auVar268,auVar306,auVar51);
                    auVar307._8_8_ = 0;
                    auVar307._0_8_ = uVar128;
                    auVar52._8_8_ = 0;
                    auVar52._0_8_ = local_298;
                    auVar198._8_8_ = 0;
                    auVar198._0_8_ = auVar154._0_8_ - xtarget;
                    auVar269._8_8_ = 0;
                    auVar269._0_8_ = ((auVar242._0_8_ - y0) - ytarget) * local_1b8;
                    auVar242 = vfmadd231sd_fma(auVar269,auVar198,auVar52);
                    auVar199._8_8_ = 0;
                    auVar199._0_8_ = this->dz;
                    auVar53._8_8_ = 0;
                    auVar53._0_8_ = dVar4;
                    auVar154 = vfmadd213sd_fma(auVar199,auVar307,auVar53);
                    auVar54._8_8_ = 0;
                    auVar54._0_8_ = local_310;
                    auVar200._8_8_ = 0;
                    auVar200._0_8_ = (auVar154._0_8_ - z0) - ztarget;
                    auVar154 = vfmadd132sd_fma(auVar200,auVar242,auVar54);
                    dVar146 = cos((double)local_388._0_8_);
                    dVar147 = sin((double)local_388._0_8_);
                    auVar308._8_8_ = 0;
                    auVar308._0_8_ = auVar341._0_8_;
                    auVar55._8_8_ = 0;
                    auVar55._0_8_ = dVar146 * dVar240 * (double)local_338._0_8_;
                    auVar201._8_8_ = 0;
                    auVar201._0_8_ = (double)local_338._0_8_ * dVar147 * dVar149 * local_258;
                    auVar289 = vfmadd231sd_fma(auVar201,local_338,auVar55);
                    auVar202._8_8_ = 0;
                    auVar202._0_8_ = this->dx;
                    auVar56._8_8_ = 0;
                    auVar56._0_8_ = uVar144;
                    auVar242 = vfmadd132sd_fma(auVar202,auVar349,auVar56);
                    auVar270._8_8_ = 0;
                    auVar270._0_8_ = this->dy;
                    auVar57._8_8_ = 0;
                    auVar57._0_8_ = dVar98;
                    auVar137 = vfmadd213sd_fma(auVar270,auVar308,auVar57);
                    auVar309._8_8_ = 0;
                    auVar309._0_8_ = dVar4;
                    auVar58._8_8_ = 0;
                    auVar58._0_8_ = local_298;
                    auVar203._8_8_ = 0;
                    auVar203._0_8_ = auVar242._0_8_ - xtarget;
                    auVar271._8_8_ = 0;
                    auVar271._0_8_ = ((auVar137._0_8_ - y0) - ytarget) * local_1b8;
                    auVar137 = vfmadd231sd_fma(auVar271,auVar203,auVar58);
                    auVar204._8_8_ = 0;
                    auVar204._0_8_ = uVar128;
                    auVar59._8_8_ = 0;
                    auVar59._0_8_ = this->dz;
                    auVar242 = vfmadd132sd_fma(auVar204,auVar309,auVar59);
                    auVar60._8_8_ = 0;
                    auVar60._0_8_ = local_310;
                    auVar205._8_8_ = 0;
                    auVar205._0_8_ = (auVar242._0_8_ - z0) - ztarget;
                    auVar242 = vfmadd132sd_fma(auVar205,auVar137,auVar60);
                    dVar149 = sin((double)local_388._0_8_);
                    dVar146 = cos((double)local_388._0_8_);
                    auVar272._8_8_ = 0;
                    auVar272._0_8_ = dVar149 * dVar240;
                    dVar150 = (double)CONCAT44(uStack_124,local_128);
                    auVar350._8_8_ = 0;
                    auVar350._0_8_ = local_278;
                    auVar61._8_8_ = 0;
                    auVar61._0_8_ = local_308;
                    auVar206._8_8_ = 0;
                    auVar206._0_8_ = dVar146 * local_228;
                    auVar137 = vfmadd231sd_fma(auVar206,auVar272,auVar61);
                    auVar273._8_8_ = 0;
                    auVar273._0_8_ = auVar289._0_8_;
                    auVar62._8_8_ = 0;
                    auVar62._0_8_ = (auVar154._0_8_ * auVar153._0_8_) / dVar145;
                    auVar207._8_8_ = 0;
                    auVar207._0_8_ =
                         auVar137._0_8_ *
                         local_2e8 * local_2e8 * ((auVar242._0_8_ * dVar101) / dVar322);
                    auVar153 = vfmadd231sd_fma(auVar207,auVar273,auVar62);
                    auVar208._8_8_ = 0;
                    local_1f8._0_8_ = auVar152._0_8_;
                    auVar63._8_8_ = 0;
                    auVar63._0_8_ = local_1f8._0_8_;
                    auVar334._8_8_ = 0;
                    auVar334._0_8_ = auVar153._0_8_ * ((dVar148 * a0z) / K);
                    auVar152 = vfmadd231sd_fma(auVar334,auVar208,auVar63);
                  }
                  else {
LAB_00111b2b:
                    auVar350 = SUB6416(ZEXT864(0),0) << 0x40;
                    auVar152 = ZEXT816(0) << 0x40;
                  }
                }
                else {
                  local_118 = SUB6416(ZEXT864(0),0) << 0x40;
                  auVar350 = SUB6416(ZEXT864(0),0) << 0x40;
                  if (((dVar104 - dVar149) * dVar321 * -2.0) / dVar97 <= dVar145) {
                    auVar152 = ZEXT816(0);
                    dVar150 = 0.0;
                    if (dVar145 <= ((dVar104 - dVar149) * (dVar321 + dVar321)) / dVar97) {
                      dVar149 = (dVar147 * 3.141592653589793 * 0.5) / dVar348;
                      local_338._0_8_ = cos(dVar149);
                      local_338._8_8_ = extraout_XMM0_Qb_04;
                      dVar150 = (dVar145 * 3.141592653589793 * 0.5) / dVar146;
                      local_2e8 = cos(dVar150);
                      local_258 = sin(dVar149);
                      dVar149 = sin(dVar150);
                      auVar209._8_8_ = 0;
                      auVar209._0_8_ = K;
                      auVar274._8_8_ = 0;
                      auVar274._0_8_ = dVar147;
                      auVar64._8_8_ = 0;
                      auVar64._0_8_ = phase;
                      auVar152 = vfmadd213sd_fma(auVar274,auVar209,auVar64);
                      __x = auVar152._0_8_;
                      local_388._0_8_ = cos(__x);
                      local_388._8_8_ = extraout_XMM0_Qb_05;
                      dVar147 = sin(__x);
                      uStack_2b0 = (undefined4)extraout_XMM0_Qb_06;
                      uStack_2ac = (undefined4)((ulong)extraout_XMM0_Qb_06 >> 0x20);
                      local_1f8._0_8_ = -dVar148;
                      local_1f8._8_4_ = 0;
                      local_1f8._12_4_ = 0x80000000;
                      dVar150 = sin(__x);
                      auVar236._0_8_ = cos(__x);
                      auVar236._8_56_ = extraout_var_00;
                      auVar120._8_8_ = 0;
                      auVar120._0_8_ = dVar238;
                      auVar122._8_8_ = 0x8000000000000000;
                      auVar122._0_8_ = dVar239;
                      auVar125._8_8_ = K;
                      auVar125._0_8_ = K;
                      auVar327._8_8_ = local_338._0_8_;
                      auVar327._0_8_ = local_338._0_8_;
                      auVar119._8_8_ = 0;
                      auVar119._0_8_ = dVar148;
                      auVar152 = vunpcklpd_avx(local_1f8,auVar119);
                      auVar113._8_4_ = uStack_2b0;
                      auVar113._0_8_ = dVar147;
                      auVar113._12_4_ = uStack_2ac;
                      auVar153 = vunpcklpd_avx(auVar120,auVar113);
                      auVar346._0_8_ = auVar152._0_8_ * local_98;
                      auVar346._8_8_ = auVar152._8_8_ * dStack_90;
                      auVar152 = vunpcklpd_avx(auVar236._0_16_,auVar122);
                      auVar275._0_8_ = local_2e8 * auVar346._0_8_ * local_2e8;
                      auVar275._8_8_ = local_2e8 * auVar346._8_8_ * local_2e8;
                      auVar116._8_8_ = extraout_XMM0_Qb_07;
                      auVar116._0_8_ = dVar150;
                      auVar154 = vunpcklpd_avx(auVar116,local_388);
                      auVar210._0_8_ =
                           local_258 * (double)local_338._0_8_ * auVar153._0_8_ * auVar152._0_8_;
                      auVar210._8_8_ =
                           local_258 * (double)local_338._0_8_ * auVar153._8_8_ * auVar152._8_8_;
                      auVar152 = vdivpd_avx(auVar275,auVar125);
                      auVar310._0_8_ = (double)local_338._0_8_ * auVar154._0_8_ * K;
                      auVar310._8_8_ = (double)local_338._0_8_ * auVar154._8_8_ * K;
                      auVar153 = vfmadd231pd_fma(auVar210,auVar327,auVar310);
                      local_118._0_8_ = auVar152._0_8_ * auVar153._0_8_;
                      local_118._8_8_ = auVar152._8_8_ * auVar153._8_8_;
                      dVar150 = -(double)local_118._0_8_;
                      if ((dVar145 == 0.0) && (!NAN(dVar145))) goto LAB_00111b2b;
                      auVar110._8_8_ = 0;
                      auVar110._0_8_ = dVar146;
                      auVar153 = vunpcklpd_avx(auVar125,auVar110);
                      auVar311._8_8_ = 0;
                      auVar311._0_8_ = dVar98;
                      local_128 = (undefined4)local_118._0_8_;
                      uStack_124 = (undefined4)((ulong)dVar150 >> 0x20);
                      auVar211._8_8_ = 0;
                      auVar211._0_8_ = dVar149 * local_2e8 * 3.141592653589793;
                      auVar152 = vshufpd_avx(auVar346,auVar211,1);
                      auVar152 = vdivpd_avx(auVar152,auVar153);
                      auVar212._8_8_ = 0;
                      auVar212._0_8_ = this->dx;
                      auVar65._8_8_ = 0;
                      auVar65._0_8_ = uVar144;
                      auVar153 = vfmadd132sd_fma(auVar212,auVar349,auVar65);
                      auVar276._8_8_ = 0;
                      auVar276._0_8_ = this->dy;
                      auVar66._8_8_ = 0;
                      auVar66._0_8_ = auVar341._0_8_;
                      auVar154 = vfmadd132sd_fma(auVar276,auVar311,auVar66);
                      auVar312._8_8_ = 0;
                      auVar312._0_8_ = uVar128;
                      auVar67._8_8_ = 0;
                      auVar67._0_8_ = local_298;
                      auVar213._8_8_ = 0;
                      auVar213._0_8_ = auVar153._0_8_ - xtarget;
                      auVar277._8_8_ = 0;
                      auVar277._0_8_ = ((auVar154._0_8_ - y0) - ytarget) * local_1b8;
                      auVar154 = vfmadd231sd_fma(auVar277,auVar213,auVar67);
                      auVar214._8_8_ = 0;
                      auVar214._0_8_ = this->dz;
                      auVar68._8_8_ = 0;
                      auVar68._0_8_ = dVar4;
                      auVar153 = vfmadd213sd_fma(auVar214,auVar312,auVar68);
                      auVar69._8_8_ = 0;
                      auVar69._0_8_ = local_310;
                      auVar215._8_8_ = 0;
                      auVar215._0_8_ = (auVar153._0_8_ - z0) - ztarget;
                      auVar154 = vfmadd132sd_fma(auVar215,auVar154,auVar69);
                      auVar153 = vshufpd_avx(auVar152,auVar152,1);
                      dVar149 = sin(__x);
                      dVar146 = cos(__x);
                      auVar313._8_8_ = 0;
                      auVar313._0_8_ = dVar98;
                      auVar70._8_8_ = 0;
                      auVar70._0_8_ = dVar149 * K * (double)local_338._0_8_;
                      auVar216._8_8_ = 0;
                      auVar216._0_8_ = (double)local_338._0_8_ * dVar146 * dVar238 * local_258;
                      auVar289 = vfmadd231sd_fma(auVar216,local_338,auVar70);
                      auVar217._8_8_ = 0;
                      auVar217._0_8_ = this->dx;
                      auVar71._8_8_ = 0;
                      auVar71._0_8_ = uVar144;
                      auVar242 = vfmadd132sd_fma(auVar217,auVar349,auVar71);
                      auVar278._8_8_ = 0;
                      auVar278._0_8_ = this->dy;
                      auVar72._8_8_ = 0;
                      auVar72._0_8_ = auVar341._0_8_;
                      auVar137 = vfmadd132sd_fma(auVar278,auVar313,auVar72);
                      auVar314._8_8_ = 0;
                      auVar314._0_8_ = uVar128;
                      auVar73._8_8_ = 0;
                      auVar73._0_8_ = local_298;
                      auVar218._8_8_ = 0;
                      auVar218._0_8_ = auVar242._0_8_ - xtarget;
                      auVar279._8_8_ = 0;
                      auVar279._0_8_ = ((auVar137._0_8_ - y0) - ytarget) * local_1b8;
                      auVar137 = vfmadd231sd_fma(auVar279,auVar218,auVar73);
                      auVar219._8_8_ = 0;
                      auVar219._0_8_ = this->dz;
                      auVar74._8_8_ = 0;
                      auVar74._0_8_ = dVar4;
                      auVar242 = vfmadd213sd_fma(auVar219,auVar314,auVar74);
                      auVar75._8_8_ = 0;
                      auVar75._0_8_ = local_310;
                      auVar220._8_8_ = 0;
                      auVar220._0_8_ = (auVar242._0_8_ - z0) - ztarget;
                      auVar242 = vfmadd132sd_fma(auVar220,auVar137,auVar75);
                      local_308 = (double)local_338._0_8_ * (double)local_338._0_8_;
                      dVar149 = cos(__x);
                      local_268 = (double)local_338._0_8_ * dVar238 * local_258;
                      dVar146 = sin(__x);
                      auVar280._8_8_ = 0;
                      auVar280._0_8_ = dVar149 * dVar240;
                      auVar315._8_8_ = 0;
                      auVar315._0_8_ = dVar98;
                      auVar76._8_8_ = 0;
                      auVar76._0_8_ = local_308;
                      auVar221._8_8_ = 0;
                      auVar221._0_8_ = dVar146 * local_268;
                      auVar137 = vfmadd231sd_fma(auVar221,auVar280,auVar76);
                      auVar281._8_8_ = 0;
                      auVar281._0_8_ = auVar289._0_8_;
                      auVar77._8_8_ = 0;
                      auVar77._0_8_ = (auVar153._0_8_ * auVar154._0_8_) / dVar145;
                      auVar222._8_8_ = 0;
                      auVar222._0_8_ =
                           auVar137._0_8_ *
                           local_2e8 * local_2e8 * ((auVar242._0_8_ * dVar101) / dVar322);
                      auVar289 = vfmadd231sd_fma(auVar222,auVar281,auVar77);
                      auVar223._8_8_ = 0;
                      auVar223._0_8_ = this->dx;
                      auVar78._8_8_ = 0;
                      auVar78._0_8_ = uVar144;
                      auVar154 = vfmadd132sd_fma(auVar223,auVar349,auVar78);
                      auVar282._8_8_ = 0;
                      auVar282._0_8_ = this->dy;
                      auVar79._8_8_ = 0;
                      auVar79._0_8_ = auVar341._0_8_;
                      auVar242 = vfmadd132sd_fma(auVar282,auVar315,auVar79);
                      auVar316._8_8_ = 0;
                      auVar316._0_8_ = uVar128;
                      auVar80._8_8_ = 0;
                      auVar80._0_8_ = local_2a8;
                      auVar224._8_8_ = 0;
                      auVar224._0_8_ = auVar154._0_8_ - xtarget;
                      auVar283._8_8_ = 0;
                      auVar283._0_8_ = ((auVar242._0_8_ - y0) - ytarget) * local_248;
                      auVar242 = vfmadd231sd_fma(auVar283,auVar224,auVar80);
                      auVar225._8_8_ = 0;
                      auVar225._0_8_ = this->dz;
                      auVar81._8_8_ = 0;
                      auVar81._0_8_ = dVar4;
                      auVar154 = vfmadd213sd_fma(auVar225,auVar316,auVar81);
                      auVar82._8_8_ = 0;
                      auVar82._0_8_ = local_218;
                      auVar226._8_8_ = 0;
                      auVar226._0_8_ = (auVar154._0_8_ - z0) - ztarget;
                      auVar154 = vfmadd132sd_fma(auVar226,auVar242,auVar82);
                      dVar149 = cos(__x);
                      dVar146 = sin(__x);
                      auVar317._8_8_ = 0;
                      auVar317._0_8_ = dVar98;
                      auVar83._8_8_ = 0;
                      auVar83._0_8_ = dVar149 * dVar240 * (double)local_338._0_8_;
                      auVar227._8_8_ = 0;
                      auVar227._0_8_ = (double)local_338._0_8_ * dVar146 * dVar239 * local_258;
                      auVar155 = vfmadd231sd_fma(auVar227,local_338,auVar83);
                      auVar228._8_8_ = 0;
                      auVar228._0_8_ = this->dx;
                      auVar84._8_8_ = 0;
                      auVar84._0_8_ = uVar144;
                      auVar242 = vfmadd132sd_fma(auVar228,auVar349,auVar84);
                      auVar284._8_8_ = 0;
                      auVar284._0_8_ = this->dy;
                      auVar85._8_8_ = 0;
                      auVar85._0_8_ = auVar341._0_8_;
                      auVar137 = vfmadd132sd_fma(auVar284,auVar317,auVar85);
                      auVar318._8_8_ = 0;
                      auVar318._0_8_ = uVar128;
                      auVar86._8_8_ = 0;
                      auVar86._0_8_ = local_2a8;
                      auVar229._8_8_ = 0;
                      auVar229._0_8_ = auVar242._0_8_ - xtarget;
                      auVar285._8_8_ = 0;
                      auVar285._0_8_ = ((auVar137._0_8_ - y0) - ytarget) * local_248;
                      auVar137 = vfmadd231sd_fma(auVar285,auVar229,auVar86);
                      auVar230._8_8_ = 0;
                      auVar230._0_8_ = this->dz;
                      auVar87._8_8_ = 0;
                      auVar87._0_8_ = dVar4;
                      auVar242 = vfmadd213sd_fma(auVar230,auVar318,auVar87);
                      auVar88._8_8_ = 0;
                      auVar88._0_8_ = local_218;
                      auVar231._8_8_ = 0;
                      auVar231._0_8_ = (auVar242._0_8_ - z0) - ztarget;
                      auVar242 = vfmadd132sd_fma(auVar231,auVar137,auVar88);
                      dVar149 = sin(__x);
                      dVar146 = cos(__x);
                      auVar117._8_8_ = 0;
                      auVar117._0_8_ = local_268;
                      auVar108._8_8_ = 0x8000000000000000;
                      auVar108._0_8_ = 0x8000000000000000;
                      auVar137 = vxorpd_avx512vl(auVar117,auVar108);
                      local_228 = auVar137._0_8_;
                      auVar286._8_8_ = 0;
                      auVar286._0_8_ = dVar149 * dVar240;
                      auVar89._8_8_ = 0;
                      auVar89._0_8_ = local_308;
                      auVar232._8_8_ = 0;
                      auVar232._0_8_ = dVar146 * local_268;
                      auVar137 = vfmsub231sd_fma(auVar232,auVar286,auVar89);
                      auVar287._8_8_ = 0;
                      auVar287._0_8_ = auVar155._0_8_;
                      auVar90._8_8_ = 0;
                      auVar90._0_8_ = (auVar154._0_8_ * auVar153._0_8_) / dVar145;
                      auVar233._8_8_ = 0;
                      auVar233._0_8_ =
                           auVar137._0_8_ *
                           local_2e8 * local_2e8 * ((auVar242._0_8_ * dVar101) / dVar322);
                      auVar153 = vfmadd231sd_fma(auVar233,auVar287,auVar90);
                      auVar91._8_8_ = 0;
                      auVar91._0_8_ = auVar289._0_8_;
                      auVar234._8_8_ = 0;
                      auVar234._0_8_ = (auVar346._0_8_ / K) * auVar153._0_8_;
                      auVar153 = vfmadd231sd_fma(auVar234,auVar152,auVar91);
                      local_278 = auVar153._0_8_;
                      local_388._8_8_ = auVar346._8_8_;
                      local_388._0_8_ = __x;
                      dVar149 = dVar239;
                      local_378._0_8_ = dVar238;
                      goto LAB_00110ed2;
                    }
                  }
                  else {
                    auVar152 = ZEXT816(0);
                    dVar150 = 0.0;
                  }
                }
                auVar153 = vshufpd_avx(local_118,local_118,1);
                dVar145 = auVar153._0_8_;
                auVar138._0_8_ =
                     (ulong)b_sign * auVar152._0_8_ +
                     (ulong)!b_sign * (auVar152._0_8_ ^ 0x8000000000000000);
                auVar138._8_8_ = auVar152._8_8_ ^ 0x8000000000000000;
                dVar149 = (double)((ulong)b_sign * (long)dVar150 + (ulong)!b_sign * (long)-dVar150);
                auVar139._0_8_ = (ulong)b_sign * (long)dVar145 + (ulong)!b_sign * (long)-dVar145;
                auVar139._8_8_ = auVar153._8_8_ ^ 0x8000000000000000;
                auVar335._8_8_ = 0;
                auVar335._0_8_ = local_298 * dVar145;
                auVar152 = vfmadd231sd_fma(auVar335,auVar350,auVar343);
                pcVar95 = (this->ce).p._M_t.
                          super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                          super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar132][lVar131];
                auVar152 = vfmadd231sd_fma(auVar152,auVar151,local_118);
                if (append) {
                  auVar92._8_8_ = 0;
                  auVar92._0_8_ = dVar142;
                  auVar340._8_8_ = 0;
                  auVar340._0_8_ = dVar145 * local_1b8;
                  auVar153 = vfmadd231sd_fma(auVar340,auVar350,auVar92);
                  auVar153 = vfmadd231sd_fma(auVar153,local_118,auVar102);
                  auVar152 = vunpcklpd_avx(auVar152,auVar153);
                  pdVar2 = (double *)((long)&pcVar95->ex + lVar130);
                  dVar146 = pdVar2[1];
                  pdVar3 = (double *)((long)&pcVar95->ex + lVar130);
                  *pdVar3 = auVar152._0_8_ + *pdVar2;
                  pdVar3[1] = auVar152._8_8_ + dVar146;
                  auVar328._8_8_ = 0;
                  auVar328._0_8_ = local_310 * dVar145;
                  auVar152 = vfmadd231sd_fma(auVar328,auVar241,auVar350);
                  auVar152 = vfmadd231sd_fma(auVar152,local_118,auVar106);
                  *(double *)((long)&pcVar95->ez + lVar130) =
                       auVar152._0_8_ + *(double *)((long)&pcVar95->ez + lVar130);
                  auVar329._0_8_ = local_298 * dVar149;
                  auVar329._8_8_ = auVar136._8_8_ * dVar149;
                  auVar336._8_8_ = auVar138._0_8_;
                  auVar336._0_8_ = auVar138._0_8_;
                  auVar152 = vfmadd132pd_fma(auVar336,auVar329,auVar135);
                  auVar330._8_8_ = auVar139._0_8_;
                  auVar330._0_8_ = auVar139._0_8_;
                  auVar319._8_8_ = 0;
                  auVar319._0_8_ = local_310 * dVar149;
                  auVar153 = vfmadd231sd_fma(auVar319,auVar241,auVar138);
                  auVar153 = vfmadd231sd_fma(auVar153,auVar106,auVar139);
                  pcVar96 = (this->cb).p._M_t.
                            super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                            super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar132][lVar131];
                  auVar152 = vfmadd213pd_fma(auVar330,auVar151,auVar152);
                  pdVar2 = (double *)((long)&pcVar96->bx + lVar130);
                  dVar149 = pdVar2[1];
                  pdVar3 = (double *)((long)&pcVar96->bx + lVar130);
                  *pdVar3 = auVar152._0_8_ + *pdVar2;
                  pdVar3[1] = auVar152._8_8_ + dVar149;
                  *(double *)((long)&pcVar96->bz + lVar130) =
                       auVar153._0_8_ + *(double *)((long)&pcVar96->bz + lVar130);
                }
                else {
                  *(long *)((long)&pcVar95->ex + lVar130) = auVar152._0_8_;
                  auVar337._8_8_ = 0;
                  auVar337._0_8_ = local_1b8 * dVar145;
                  auVar152 = vfmadd231sd_fma(auVar337,auVar350,auVar345);
                  auVar331._8_8_ = 0;
                  auVar331._0_8_ = local_310 * dVar145;
                  auVar153 = vfmadd231sd_fma(auVar331,auVar241,auVar350);
                  auVar152 = vfmadd231sd_fma(auVar152,local_118,auVar102);
                  auVar153 = vfmadd231sd_fma(auVar153,local_118,auVar106);
                  *(long *)((long)&pcVar95->ey + lVar130) = auVar152._0_8_;
                  *(long *)((long)&pcVar95->ez + lVar130) = auVar153._0_8_;
                  auVar332._8_8_ = 0;
                  auVar332._0_8_ = local_298 * dVar149;
                  auVar152 = vfmadd231sd_fma(auVar332,auVar138,auVar343);
                  auVar347._8_8_ = 0;
                  auVar347._0_8_ = local_1b8 * dVar149;
                  auVar153 = vfmadd231sd_fma(auVar347,auVar138,auVar345);
                  auVar320._8_8_ = 0;
                  auVar320._0_8_ = local_310 * dVar149;
                  auVar154 = vfmadd231sd_fma(auVar320,auVar241,auVar138);
                  auVar152 = vfmadd231sd_fma(auVar152,auVar139,auVar151);
                  auVar153 = vfmadd231sd_fma(auVar153,auVar139,auVar102);
                  auVar154 = vfmadd231sd_fma(auVar154,auVar106,auVar139);
                  pcVar96 = (this->cb).p._M_t.
                            super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                            super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar132][lVar131];
                  *(long *)((long)&pcVar96->bx + lVar130) = auVar152._0_8_;
                  *(long *)((long)&pcVar96->by + lVar130) = auVar153._0_8_;
                  *(long *)((long)&pcVar96->bz + lVar130) = auVar154._0_8_;
                }
              }
              auVar341._8_8_ = 0;
              uVar128 = (ulong)this->nz;
              lVar133 = lVar133 + 1;
              lVar130 = lVar130 + 0x18;
              auVar152 = auVar341;
            } while (lVar133 < (long)uVar128);
            iVar129 = this->ny;
          }
          lVar131 = lVar131 + 1;
        } while (lVar131 < iVar129);
        iVar127 = this->nx;
      }
      lVar132 = lVar132 + 1;
    } while (lVar132 < iVar127);
  }
  return;
}

Assistant:

void spatial_region::f_init_focused(double a0y, double a0z, double xsigma, double sigma0, double x0, double x1, bool b_sign, double phase, double y0, double z0, bool append, double phi, int sscos, double K, double xtarget, double ytarget, double ztarget)
{
    /* sigma0 - поперечный размер в перетяжке (импульс
     * аксиально-симметричный), x0 - положение центра лазерного
     * импульса, x1 - координата по x центра лазерного импульса
     * относительно центра перетяжки */
    /* y0, z0 - смещение центра импульса от оси области,
     * обеспечивающее нужный угол падения. Поворот импульса
     * производится так, что ey остаётся лежать в плоскости xy */
    /* ey задаётся симметричным (если бы импульс был плоским), ez -
     * антисимметричным (по продольной координате) */
    /* Интеграл от квадратов полей не вычисляется аналитически в
     * простой форме, поэтому используется \int a^2 dV. Поля задаются
     * таким образом, чтобы \int a^2 dV имел то же значение, что и для
     * f_init_gauss, поэтому вместо xsigma, ysigma и zsigma для
     * описания огибающей используются половины полных размеров
     * импульса xs и s (половина поперечного размера) */
    // K is a wavevector, K = 1 for first harmonic and 2 for the second.
    double sign = (x1<=0)-(x1>0);
    x1 = sqrt(x1*x1+y0*y0+z0*z0);
    if (x1==0) x1 = dx; // иначе не определён угол поворота импульса
    double xR = K * sigma0*sigma0/2;
    double sigma = sigma0*sqrt(1+x1*x1/xR/xR); // в начальном положении
    // ratio of first and second harmonics beam sizes at initial position
    double a_multiplier = sqrt(1 + x1 * x1 / (sigma0 * sigma0 * sigma0 * sigma0 / 4)) / sqrt(1 + x1 * x1 / (xR * xR));
    double xs = xsigma*2*sqrt(2*PI)/3;
    if ( sscos == 1 )
        xs = 0.822*xsigma;
    double s = sigma/2/sqrt(((double)3)/16-1/PI/PI);
    double s0 = sigma0/2/sqrt(((double)3)/16-1/PI/PI);
    double y12,z12;
    y12 = ny*dy/2;
    z12 = nz*dz/2;
    double r0x,r0y,r0z;
    r0x = sign*sqrt(x1*x1-y0*y0-z0*z0);
    r0x = r0x/x1;
    r0y = -y0/x1;
    r0z = -z0/x1;
    double y0x,y0y,y0z,z0x,z0y,z0z;
    y0z = sqrt( r0x*r0x + r0y*r0y );
    if (y0z!=0)
    {
        y0x = -r0y/y0z;
        y0y = r0x/y0z;
        y0z = 0;
    }
    else
    {
        y0x = 0;
        y0y = 1;
        y0z = 0;
    }
    z0x = r0y*y0z - r0z*y0y;
    z0y = r0z*y0x - r0x*y0z;
    z0z = r0x*y0y - r0y*y0x;
    if (phi!=0) {
        double c,s,yx,yy,yz,zx,zy,zz;
        c = cos(phi);
        s = sin(phi);
        yx = y0x;
        yy = y0y;
        yz = y0z;
        zx = z0x;
        zy = z0y;
        zz = z0z;
        y0x = yx*c + zx*s;
        y0y = yy*c + zy*s;
        y0z = yz*c + zz*s;
        z0x = zx*c - yx*s;
        z0y = zy*c - yy*s;
        z0z = zz*c - yz*s;
    }
    double xi,x,r,cosx,cosr,sinx,sinr;
    double slocal,alocal;
    double ex,ey,ez,bx,by,bz;
    for(int i=0;i<nx;i++)
    {
        for(int j=0;j<ny;j++)
        {
            for(int k=0;k<nz;k++)
            {
                x = r0x*(i*dx-x0-xtarget) + r0y*(j*dy-y12-y0-ytarget) + r0z*(k*dz-z12-z0-ztarget);
                r = sqrt( (i*dx-x0-xtarget)*(i*dx-x0-xtarget) + (j*dy-y12-y0-ytarget)*(j*dy-y12-y0-ytarget) + (k*dz-z12-z0-ztarget)*(k*dz-z12-z0-ztarget) - x*x );
                xi = x + r*r/2*(x-x1)/((x-x1)*(x-x1)+xR*xR) - atan((x-x1)/xR) - atan(x1/xR);
                slocal = s0*sqrt( 1 + (xi-x1+atan(x1/xR))*(xi-x1+atan(x1/xR))/(xR*xR) );
                alocal = s/slocal * a_multiplier;
                if ( xi>-xs && xi<xs && r<slocal )
                {
                    if ( sscos == 1 ) {
                        cosx = cos(PI*xi*xi*xi*xi/2/(xs*xs*xs*xs));
                        cosr = cos(PI*r/2/slocal);
                        sinx = sin(PI*xi*xi*xi*xi/2/(xs*xs*xs*xs));
                        sinr = sin(PI*r/2/slocal);
                        double xxi = K * xi + phase;
                        // envelope = (cosx*cosr)^2;
                        ey = alocal*a0y*cosr*cosr / K * (K * cos(xxi)*cosx*cosx - 4*PI*xi*xi*xi/(xs*xs*xs*xs)*sin(xxi)*cosx*sinx);
                        ez = -alocal*a0z*cosr*cosr / K * (K * sin(xxi)*cosx*cosx + 4*PI*xi*xi*xi/(xs*xs*xs*xs)*cos(xxi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        if (r!=0)
                            ex = alocal*a0y / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)/r*( K * sin(xxi)*cosx*cosx+4*PI*xi*xi*xi/(xs*xs*xs*xs)*cos(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * cos(xxi))+4*PI*xi*xi*xi/(xs*xs*xs*xs)*cosx*sinx*sin(xxi)) ) - alocal*a0z / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)/r*((-K * cos(xxi))*cosx*cosx-4*PI*xi*xi*xi/(xs*xs*xs*xs)*sin(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * sin(xxi))-4*PI*xi*xi*xi/(xs*xs*xs*xs)*cosx*sinx*cos(xxi)) );
                        else
                            ex = 0;
                        if (r!=0)
                            bx = alocal*a0y / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)/r*(K * sin(xxi)*cosx*cosx+4*PI*xi*xi*xi/(xs*xs*xs*xs)*cos(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * cos(xxi))+4*PI*xi*xi*xi/(xs*xs*xs*xs)*cosx*sinx*sin(xxi)) ) + alocal*a0z / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)/r*((-K * cos(xxi))*cosx*cosx-4*PI*xi*xi*xi/(xs*xs*xs*xs)*sin(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * sin(xxi))-4*PI*xi*xi*xi/(xs*xs*xs*xs)*cosx*sinx*cos(xxi)) );
                        else
                            bx = 0;
                    } else if (-2 * s0 * (x1 - x) / xR <= r && r <= 2 * s0 * (x1 - x) / xR) { // otherwise unphysical wings arise
                        cosx = cos(PI*xi/2/xs);
                        cosr = cos(PI*r/2/slocal);
                        sinx = sin(PI*xi/2/xs);
                        sinr = sin(PI*r/2/slocal);
                        double xxi = K * xi + phase;
                        // envelope = (cosx*cosr)^2;
                        ey = alocal*a0y*cosr*cosr / K * (K * cos(xxi)*cosx*cosx - PI/xs*sin(xxi)*cosx*sinx);
                        ez = -alocal*a0z*cosr*cosr / K * (K * sin(xxi)*cosx*cosx + PI/xs*cos(xxi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        if (r!=0)
                            ex = alocal*a0y / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)/r*(K * sin(xxi)*cosx*cosx+PI/xs*cos(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * cos(xxi))+PI/xs*cosx*sinx*sin(xxi)) ) - alocal*a0z / K *( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)/r*((-K * cos(xxi))*cosx*cosx-PI/xs*sin(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * sin(xxi))-PI/xs*cosx*sinx*cos(xxi)) );
                        else
                            ex = 0;
                        if (r!=0)
                            bx = alocal*a0y / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)/r*(K * sin(xxi)*cosx*cosx+PI/xs*cos(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * cos(xxi))+PI/xs*cosx*sinx*sin(xxi)) ) + alocal*a0z / K *( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)/r*((-K * cos(xxi))*cosx*cosx-PI/xs*sin(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * sin(xxi))-PI/xs*cosx*sinx*cos(xxi)) );
                        else
                            bx = 0;
                    } else {
                        ex = 0;
                        ey = 0;
                        ez = 0;
                        bx = 0;
                        by = 0;
                        bz = 0;
                    }
                    if (b_sign==0)
                    {
                        bx = -bx;
                        by = -by;
                        bz = -bz;
                    }
                    if (append==0)
                    {
                        // прежние значения перезаписываются
                        ce[i][j][k].ex = ex*r0x + ey*y0x + ez*z0x;
                        ce[i][j][k].ey = ex*r0y + ey*y0y + ez*z0y;
                        ce[i][j][k].ez = ex*r0z + ey*y0z + ez*z0z;
                        cb[i][j][k].bx = bx*r0x + by*y0x + bz*z0x;
                        cb[i][j][k].by = bx*r0y + by*y0y + bz*z0y;
                        cb[i][j][k].bz = bx*r0z + by*y0z + bz*z0z;
                    }
                    else
                    {
                        // импульс добавляется к имеющимся полям
                        ce[i][j][k].ex += ex*r0x + ey*y0x + ez*z0x;
                        ce[i][j][k].ey += ex*r0y + ey*y0y + ez*z0y;
                        ce[i][j][k].ez += ex*r0z + ey*y0z + ez*z0z;
                        cb[i][j][k].bx += bx*r0x + by*y0x + bz*z0x;
                        cb[i][j][k].by += bx*r0y + by*y0y + bz*z0y;
                        cb[i][j][k].bz += bx*r0z + by*y0z + bz*z0z;
                    }
                }
                else if (append==0)
                {
                    ce[i][j][k].ex = 0;
                    ce[i][j][k].ey = 0;
                    ce[i][j][k].ez = 0;
                    cb[i][j][k].bx = 0;
                    cb[i][j][k].by = 0;
                    cb[i][j][k].bz = 0;
                }
            }
        }
    }
}